

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

void xcb_input_valuator_state_next(xcb_input_valuator_state_iterator_t *i)

{
  long lVar1;
  void *_buffer;
  int iVar2;
  long lVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  xcb_input_valuator_state_t *R;
  xcb_generic_iterator_t child;
  int local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _buffer = (void *)*in_RDI;
  iVar2 = xcb_input_valuator_state_sizeof(_buffer);
  lVar3 = (long)_buffer + (long)iVar2;
  local_18 = (int)lVar3;
  *(int *)((long)in_RDI + 0xc) = local_18 - (int)*in_RDI;
  *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
  *in_RDI = lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
xcb_input_valuator_state_next (xcb_input_valuator_state_iterator_t *i)
{
    xcb_input_valuator_state_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_valuator_state_t *)(((char *)R) + xcb_input_valuator_state_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_valuator_state_t *) child.data;
}